

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall llvm::DWARFVerifier::verifyDebugInfoCallSite(DWARFVerifier *this,DWARFDie *Die)

{
  DIDumpOptions DumpOpts;
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DumpOpts_01;
  bool bVar1;
  DWARFAbbreviationDeclaration *pDVar2;
  raw_ostream *prVar3;
  undefined1 in_R8B;
  uint uVar4;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  ArrayRef<llvm::dwarf::Attribute> Attrs;
  undefined1 local_100 [8];
  Optional<llvm::DWARFFormValue> CallAttr;
  DWARFDie local_38;
  
  pDVar2 = DWARFDie::getAbbreviationDeclarationPtr(Die);
  if ((pDVar2 == (DWARFAbbreviationDeclaration *)0x0) || (pDVar2->Tag != DW_TAG_call_site)) {
    pDVar2 = DWARFDie::getAbbreviationDeclarationPtr(Die);
    if (pDVar2 == (DWARFAbbreviationDeclaration *)0x0) {
      return 0;
    }
    if (pDVar2->Tag != DW_TAG_GNU_call_site) {
      return 0;
    }
  }
  local_38 = DWARFDie::getParent(Die);
  if (local_38.Die != (DWARFDebugInfoEntry *)0x0 && local_38.U != (DWARFUnit *)0x0) {
    while (bVar1 = DWARFDie::isSubprogramDIE(&local_38), !bVar1) {
      if ((local_38.U == (DWARFUnit *)0x0) || (local_38.Die == (DWARFDebugInfoEntry *)0x0)) {
        __assert_fail("isValid() && \"must check validity prior to calling\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                      ,0x3b,
                      "const DWARFAbbreviationDeclaration *llvm::DWARFDie::getAbbreviationDeclarationPtr() const"
                     );
      }
      if (((local_38.Die)->AbbrevDecl != (DWARFAbbreviationDeclaration *)0x0) &&
         ((local_38.Die)->AbbrevDecl->Tag == DW_TAG_inlined_subroutine)) {
        prVar3 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        Str_01.Length = 0x31;
        Str_01.Data = "Call site entry nested within inlined subroutine:";
        raw_ostream::operator<<(prVar3,Str_01);
        prVar3 = this->OS;
        Die = &local_38;
        goto LAB_00b19b97;
      }
      local_38 = DWARFDie::getParent(Die);
      if ((local_38.U == (DWARFUnit *)0x0) || (local_38.Die == (DWARFDebugInfoEntry *)0x0)) break;
    }
  }
  if ((local_38.U == (DWARFUnit *)0x0) || (local_38.Die == (DWARFDebugInfoEntry *)0x0)) {
    prVar3 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    Str_00.Length = 0x35;
    Str_00.Data = "Call site entry not nested within a valid subprogram:";
    raw_ostream::operator<<(prVar3,Str_00);
    prVar3 = this->OS;
LAB_00b19b97:
    DumpOpts_01.ParentRecurseDepth = 0xffffffff;
    DumpOpts_01.Version = 0;
    DumpOpts_01.AddrSize = '\x04';
    DumpOpts_01.ShowAddresses = true;
    DumpOpts_01.DumpType = 0xffffffff;
    DumpOpts_01.ChildRecurseDepth = 0xffffffff;
    DumpOpts_01.ShowChildren = false;
    DumpOpts_01.ShowParents = false;
    DumpOpts_01.ShowForm = false;
    DumpOpts_01.SummarizeTypes = false;
    DumpOpts_01.Verbose = false;
    DumpOpts_01.DisplayRawContents = false;
    DumpOpts_01._22_2_ = 0;
    DWARFDie::dump(Die,prVar3,0,DumpOpts_01);
    uVar4 = 1;
  }
  else {
    CallAttr.Storage.hasVal = true;
    CallAttr.Storage._49_7_ = 0x2117007c007b00;
    Attrs.Length = 6;
    Attrs.Data = (Attribute *)&CallAttr.Storage.hasVal;
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_100,&local_38,Attrs);
    uVar4 = 0;
    if (CallAttr.Storage.field_0._40_1_ == '\0') {
      prVar3 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,(StringRef)ZEXT816(0),
                                (bool)in_R8B);
      Str.Length = 0x3c;
      Str.Data = "Subprogram with call site entry has no DW_AT_call attribute:";
      raw_ostream::operator<<(prVar3,Str);
      DumpOpts.ParentRecurseDepth = 0xffffffff;
      DumpOpts.Version = 0;
      DumpOpts.AddrSize = '\x04';
      DumpOpts.ShowAddresses = true;
      DumpOpts.DumpType = 0xffffffff;
      DumpOpts.ChildRecurseDepth = 0xffffffff;
      DumpOpts.ShowChildren = false;
      DumpOpts.ShowParents = false;
      DumpOpts.ShowForm = false;
      DumpOpts.SummarizeTypes = false;
      DumpOpts.Verbose = false;
      DumpOpts.DisplayRawContents = false;
      DumpOpts._22_2_ = 0;
      DWARFDie::dump(&local_38,this->OS,0,DumpOpts);
      uVar4 = 1;
      DumpOpts_00.ParentRecurseDepth = 0xffffffff;
      DumpOpts_00.Version = 0;
      DumpOpts_00.AddrSize = '\x04';
      DumpOpts_00.ShowAddresses = true;
      DumpOpts_00.DumpType = 0xffffffff;
      DumpOpts_00.ChildRecurseDepth = 0xffffffff;
      DumpOpts_00.ShowChildren = false;
      DumpOpts_00.ShowParents = false;
      DumpOpts_00.ShowForm = false;
      DumpOpts_00.SummarizeTypes = false;
      DumpOpts_00.Verbose = false;
      DumpOpts_00.DisplayRawContents = false;
      DumpOpts_00._22_2_ = 0;
      DWARFDie::dump(Die,this->OS,1,DumpOpts_00);
    }
  }
  return uVar4;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoCallSite(const DWARFDie &Die) {
  if (Die.getTag() != DW_TAG_call_site && Die.getTag() != DW_TAG_GNU_call_site)
    return 0;

  DWARFDie Curr = Die.getParent();
  for (; Curr.isValid() && !Curr.isSubprogramDIE(); Curr = Die.getParent()) {
    if (Curr.getTag() == DW_TAG_inlined_subroutine) {
      error() << "Call site entry nested within inlined subroutine:";
      Curr.dump(OS);
      return 1;
    }
  }

  if (!Curr.isValid()) {
    error() << "Call site entry not nested within a valid subprogram:";
    Die.dump(OS);
    return 1;
  }

  Optional<DWARFFormValue> CallAttr =
      Curr.find({DW_AT_call_all_calls, DW_AT_call_all_source_calls,
                 DW_AT_call_all_tail_calls, DW_AT_GNU_all_call_sites,
                 DW_AT_GNU_all_source_call_sites,
                 DW_AT_GNU_all_tail_call_sites});
  if (!CallAttr) {
    error() << "Subprogram with call site entry has no DW_AT_call attribute:";
    Curr.dump(OS);
    Die.dump(OS, /*indent*/ 1);
    return 1;
  }

  return 0;
}